

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CowConfig.hpp
# Opt level: O0

void __thiscall CowConfig::CowConfig(CowConfig *this,string *fileName)

{
  string local_48;
  string *local_18;
  string *fileName_local;
  CowConfig *this_local;
  
  local_18 = fileName;
  fileName_local = (string *)this;
  std::ofstream::ofstream(this);
  std::fstream::fstream(&this->ReadConfig);
  this->FirstLine = true;
  this->FirstRead = true;
  std::__cxx11::string::string((string *)&this->FileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Lines);
  std::__cxx11::string::string((string *)&local_48,(string *)fileName);
  OpenFile(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

CowConfig(std::string fileName){
    		OpenFile(fileName);
	}